

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O2

void __thiscall
Kernel::BooleanSubtermIt::BooleanSubtermIt(BooleanSubtermIt *this,Term *term,bool includeSelf)

{
  Stack<Kernel::Term_*> *this_00;
  Term *elem;
  Term *elem_00;
  ulong uVar1;
  
  (this->super_IteratorCore<Kernel::TermList>)._refCnt = 0;
  (this->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore =
       (_func_int **)&PTR__BooleanSubtermIt_009ffad0;
  (this->super_IteratorCore<Kernel::TermList>).field_0xc = 1;
  (this->_next)._content = 2;
  this_00 = &this->_stack;
  Lib::Stack<Kernel::Term_*>::Stack(this_00,8);
  if ((term->_args[0]._content & 0x10) == 0) {
    Lib::Stack<Kernel::Term_*>::push(this_00,term);
  }
  else {
    uVar1 = (ulong)(*(uint *)&term->field_0xc & 0xfffffff);
    elem = (Term *)term->_args[uVar1 - 1]._content;
    elem_00 = (Term *)term->_args[uVar1]._content;
    if (((ulong)elem_00 & 1) == 0) {
      Lib::Stack<Kernel::Term_*>::push(this_00,elem_00);
    }
    if (((ulong)elem & 1) == 0) {
      Lib::Stack<Kernel::Term_*>::push(this_00,elem);
    }
  }
  return;
}

Assistant:

BooleanSubtermIt(Term* term, bool includeSelf=false) 
  : _used(true), _stack(8)
  {
    if(term->isLiteral()){
      TermList t0 = *term->nthArgument(0);
      TermList t1 = *term->nthArgument(1);
      if(!t0.isVar()){ _stack.push(t0.term()); }
      if(!t1.isVar()){ _stack.push(t1.term()); }      
      return;      
    } 
    _stack.push(term);
  }